

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O2

void __thiscall
solitaire::SolitaireHandWithOneCardTest_tryPutCardsBack_Test::TestBody
          (SolitaireHandWithOneCardTest_tryPutCardsBack_Test *this)

{
  Cards *pCVar1;
  Solitaire *this_00;
  MoveCardsOperationSnapshotCreatorMock *in_RSI;
  char *in_R9;
  AssertHelper local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  string local_40;
  AssertionResult gtest_ar_;
  
  local_40._M_dataplus._M_p =
       (pointer)archivers::MoveCardsOperationSnapshotCreatorMock::gmock_restoreSourcePile
                          ((MockSpec<void_()> *)
                           (this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
                           super_SolitaireTest.moveCardsOperationSnapshotCreatorMock.rawPointer,
                           in_RSI);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            ((MockSpec<void_()> *)&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x1b6,"*moveCardsOperationSnapshotCreatorMock","restoreSourcePile()");
  this_00 = &(this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.solitaire;
  Solitaire::tryPutCardsBackFromHand(this_00);
  pCVar1 = Solitaire::getCardsInHand(this_00);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (pCVar1->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)
       ._M_impl.super__Vector_impl_data._M_start ==
       (pCVar1->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,
               (AssertionResult *)"solitaire.getCardsInHand().empty()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x1b8,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(SolitaireHandWithOneCardTest, tryPutCardsBack) {
    EXPECT_CALL(*moveCardsOperationSnapshotCreatorMock, restoreSourcePile());
    solitaire.tryPutCardsBackFromHand();
    EXPECT_TRUE(solitaire.getCardsInHand().empty());
}